

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestCoverageHandler.cxx
# Opt level: O2

bool IsFileInDir(string *infile,string *indir)

{
  bool bVar1;
  string_view str;
  string_view prefix;
  string dir;
  string file;
  string local_48;
  string local_28;
  
  cmsys::SystemTools::CollapseFullPath(&local_28,infile);
  cmsys::SystemTools::CollapseFullPath(&local_48,indir);
  if (local_48._M_string_length < local_28._M_string_length) {
    str._M_str = local_28._M_dataplus._M_p;
    str._M_len = local_28._M_string_length;
    prefix._M_str = local_48._M_dataplus._M_p;
    prefix._M_len = local_48._M_string_length;
    bVar1 = cmHasPrefix(str,prefix);
    if (bVar1) {
      bVar1 = local_28._M_dataplus._M_p[local_48._M_string_length] == '/';
      goto LAB_0017c5bf;
    }
  }
  bVar1 = false;
LAB_0017c5bf:
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_28);
  return bVar1;
}

Assistant:

static bool IsFileInDir(const std::string& infile, const std::string& indir)
{
  std::string file = cmSystemTools::CollapseFullPath(infile);
  std::string dir = cmSystemTools::CollapseFullPath(indir);

  return file.size() > dir.size() && fnc_prefix(file, dir) &&
    file[dir.size()] == '/';
}